

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

int tinyexr::ParseEXRHeader
              (HeaderInfo *info,bool *empty_header,EXRVersion *version,string *err,uchar *buf,
              size_t size)

{
  byte bVar1;
  int iVar2;
  pointer p_Var3;
  bool bVar4;
  bool bVar5;
  size_type sVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  int iVar14;
  uchar *__dest;
  reference __src;
  float *pfVar15;
  int *piVar16;
  ostream *poVar17;
  long lVar18;
  int local_31c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  size_t local_2f0;
  string attr_name;
  size_t marker_size;
  string attr_type;
  EXRAttribute attrib;
  
  if (empty_header != (bool *)0x0) {
    *empty_header = false;
  }
  if (((size == 0) || (version->multipart == 0)) || (*buf != '\0')) {
    info->display_window[2] = 0;
    info->display_window[3] = 0;
    info->screen_window_center[0] = 0.0;
    info->screen_window_center[1] = 0.0;
    info->line_order = 0;
    info->display_window[0] = 0;
    info->display_window[1] = 0;
    info->display_window[2] = 0;
    info->data_window[0] = 0;
    info->data_window[1] = 0;
    info->data_window[2] = 0;
    info->data_window[3] = 0;
    info->screen_window_width = -1.0;
    info->pixel_aspect_ratio = -1.0;
    info->tile_size_x = -1;
    info->tile_size_y = -1;
    info->tile_level_mode = -1;
    info->tile_rounding_mode = -1;
    p_Var3 = (info->attributes).super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((info->attributes).super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>._M_impl
        .super__Vector_impl_data._M_finish != p_Var3) {
      (info->attributes).super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>._M_impl.
      super__Vector_impl_data._M_finish = p_Var3;
    }
    lVar18 = 0x401;
    bVar8 = false;
    bVar4 = false;
    bVar9 = false;
    bVar10 = false;
    bVar5 = false;
    bVar11 = false;
    bVar12 = false;
    bVar13 = false;
    local_2f0 = size;
    while (lVar18 = lVar18 + -1, lVar18 != 0) {
      if (local_2f0 == 0) {
        if (err == (string *)0x0) {
          return -4;
        }
        std::__cxx11::string::append((char *)err);
        return -4;
      }
      if (*buf == '\0') {
        local_2f0 = local_2f0 - 1;
        break;
      }
      attr_name._M_dataplus._M_p = (pointer)&attr_name.field_2;
      attr_name._M_string_length = 0;
      attr_name.field_2._M_local_buf[0] = '\0';
      attr_type._M_dataplus._M_p = (pointer)&attr_type.field_2;
      attr_type._M_string_length = 0;
      attr_type.field_2._M_local_buf[0] = '\0';
      data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar7 = ReadAttribute(&attr_name,&attr_type,&data,&marker_size,(char *)buf,local_2f0);
      if (bVar7) {
        buf = buf + marker_size;
        local_2f0 = local_2f0 - marker_size;
        if ((version->tiled == 0) ||
           (iVar14 = std::__cxx11::string::compare((char *)&attr_name), iVar14 != 0)) {
          iVar14 = std::__cxx11::string::compare((char *)&attr_name);
          if (iVar14 == 0) {
            if (4 < *data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start) {
              if (err != (string *)0x0) {
                std::__cxx11::string::assign((char *)err);
              }
              local_31c = -8;
              goto LAB_0019d3d2;
            }
            info->compression_type =
                 (uint)*data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start;
            bVar7 = true;
            bVar4 = true;
          }
          else {
            iVar14 = std::__cxx11::string::compare((char *)&attr_name);
            if (iVar14 == 0) {
              bVar7 = ReadChannelInfo(&info->channels,&data);
              if ((!bVar7) ||
                 (bVar7 = true,
                 (info->channels).
                 super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>.
                 _M_impl.super__Vector_impl_data._M_finish ==
                 (info->channels).
                 super__Vector_base<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>.
                 _M_impl.super__Vector_impl_data._M_start)) {
                if (err != (string *)0x0) {
                  std::__cxx11::string::append((char *)err);
                }
                goto LAB_0019d3cd;
              }
              bVar8 = true;
            }
            else {
              iVar14 = std::__cxx11::string::compare((char *)&attr_name);
              if (iVar14 == 0) {
                if ((ulong)((long)data.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)data.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start) < 0x10)
                goto LAB_0019d703;
                piVar16 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                           (&data,0);
                info->data_window[0] = *piVar16;
                piVar16 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                           (&data,4);
                info->data_window[1] = *piVar16;
                piVar16 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                           (&data,8);
                info->data_window[2] = *piVar16;
                piVar16 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                           (&data,0xc);
                info->data_window[3] = *piVar16;
                bVar7 = true;
                bVar9 = true;
              }
              else {
                iVar14 = std::__cxx11::string::compare((char *)&attr_name);
                if (iVar14 == 0) {
                  bVar7 = true;
                  if (0xf < (ulong)((long)data.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)data.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start)) {
                    piVar16 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                               (&data,0);
                    info->display_window[0] = *piVar16;
                    piVar16 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                               (&data,4);
                    info->display_window[1] = *piVar16;
                    piVar16 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                               (&data,8);
                    info->display_window[2] = *piVar16;
                    piVar16 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                               (&data,0xc);
                    info->display_window[3] = *piVar16;
                    bVar7 = true;
                    bVar10 = true;
                  }
                }
                else {
                  iVar14 = std::__cxx11::string::compare((char *)&attr_name);
                  if (iVar14 == 0) {
                    if (data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish ==
                        data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start) goto LAB_0019d703;
                    info->line_order =
                         (uint)*data.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start;
                    bVar7 = true;
                    bVar5 = true;
                  }
                  else {
                    iVar14 = std::__cxx11::string::compare((char *)&attr_name);
                    if (iVar14 == 0) {
                      bVar7 = true;
                      if (3 < (ulong)((long)data.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)data.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start)) {
                        pfVar15 = (float *)std::
                                           vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                                     (&data,0);
                        info->pixel_aspect_ratio = *pfVar15;
                        bVar7 = true;
                        bVar11 = true;
                      }
                    }
                    else {
                      iVar14 = std::__cxx11::string::compare((char *)&attr_name);
                      if (iVar14 == 0) {
                        if ((ulong)((long)data.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)data.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start) < 8) {
LAB_0019d703:
                          bVar7 = true;
                        }
                        else {
                          pfVar15 = (float *)std::
                                             vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                             at(&data,0);
                          info->screen_window_center[0] = *pfVar15;
                          pfVar15 = (float *)std::
                                             vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                             at(&data,4);
                          info->screen_window_center[1] = *pfVar15;
                          bVar7 = true;
                          bVar12 = true;
                        }
                      }
                      else {
                        iVar14 = std::__cxx11::string::compare((char *)&attr_name);
                        if (iVar14 == 0) {
                          if ((ulong)((long)data.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)data.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start) < 4)
                          goto LAB_0019d703;
                          pfVar15 = (float *)std::
                                             vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                             at(&data,0);
                          info->screen_window_width = *pfVar15;
                          bVar7 = true;
                          bVar13 = true;
                        }
                        else {
                          iVar14 = std::__cxx11::string::compare((char *)&attr_name);
                          if (iVar14 == 0) {
                            bVar7 = true;
                            if (3 < (ulong)((long)data.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)data.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)) {
                              piVar16 = (int *)std::
                                               vector<unsigned_char,_std::allocator<unsigned_char>_>
                                               ::at(&data,0);
                              info->chunk_count = *piVar16;
                            }
                          }
                          else {
                            bVar7 = true;
                            if ((ulong)(((long)(info->attributes).
                                               super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)(info->attributes).
                                              super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>
                                              ._M_impl.super__Vector_impl_data._M_start) / 0x210) <
                                0x80) {
                              strncpy(attrib.name,attr_name._M_dataplus._M_p,0xff);
                              strncpy(attrib.type,attr_type._M_dataplus._M_p,0xff);
                              attrib.name[0xff] = '\0';
                              attrib.type[0xff] = '\0';
                              attrib.size = (int)((long)data.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                 (long)data.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                              __dest = (uchar *)malloc((long)data.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)data.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                              attrib.value = __dest;
                              __src = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                                (&data,0);
                              memcpy(__dest,__src,
                                     (long)data.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)data.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start);
                              std::vector<_EXRAttribute,_std::allocator<_EXRAttribute>_>::push_back
                                        (&info->attributes,&attrib);
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        else {
          if ((long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start != 9) {
            __assert_fail("data.size() == 9",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/ThirdParty/tinyexr.h"
                          ,0x290b,
                          "int tinyexr::ParseEXRHeader(HeaderInfo *, bool *, const EXRVersion *, std::string *, const unsigned char *, size_t)"
                         );
          }
          piVar16 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&data,0);
          iVar14 = *piVar16;
          piVar16 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at(&data,4);
          iVar2 = *piVar16;
          bVar1 = data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start[8];
          info->tile_size_x = iVar14;
          info->tile_size_y = iVar2;
          info->tile_level_mode = bVar1 & 3;
          info->tile_rounding_mode = bVar1 >> 4 & 1;
          bVar7 = true;
        }
      }
      else {
        if (err != (string *)0x0) {
          std::__cxx11::string::append((char *)err);
        }
LAB_0019d3cd:
        local_31c = -4;
LAB_0019d3d2:
        bVar7 = false;
      }
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      std::__cxx11::string::~string((string *)&attr_type);
      std::__cxx11::string::~string((string *)&attr_name);
      if (!bVar7) {
        return local_31c;
      }
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&attrib);
    if (!bVar4) {
      poVar17 = std::operator<<((ostream *)(attrib.name + 0x10),
                                "\"compression\" attribute not found in the header.");
      std::endl<char,std::char_traits<char>>(poVar17);
    }
    if (!bVar8) {
      poVar17 = std::operator<<((ostream *)(attrib.name + 0x10),
                                "\"channels\" attribute not found in the header.");
      std::endl<char,std::char_traits<char>>(poVar17);
    }
    if (!bVar5) {
      poVar17 = std::operator<<((ostream *)(attrib.name + 0x10),
                                "\"lineOrder\" attribute not found in the header.");
      std::endl<char,std::char_traits<char>>(poVar17);
    }
    if (!bVar10) {
      poVar17 = std::operator<<((ostream *)(attrib.name + 0x10),
                                "\"displayWindow\" attribute not found in the header.");
      std::endl<char,std::char_traits<char>>(poVar17);
    }
    if (!bVar9) {
      poVar17 = std::operator<<((ostream *)(attrib.name + 0x10),
                                "\"dataWindow\" attribute not found in the header or invalid.");
      std::endl<char,std::char_traits<char>>(poVar17);
    }
    if (!bVar11) {
      poVar17 = std::operator<<((ostream *)(attrib.name + 0x10),
                                "\"pixelAspectRatio\" attribute not found in the header.");
      std::endl<char,std::char_traits<char>>(poVar17);
    }
    if (!bVar13) {
      poVar17 = std::operator<<((ostream *)(attrib.name + 0x10),
                                "\"screenWindowWidth\" attribute not found in the header.");
      std::endl<char,std::char_traits<char>>(poVar17);
    }
    if (!bVar12) {
      poVar17 = std::operator<<((ostream *)(attrib.name + 0x10),
                                "\"screenWindowCenter\" attribute not found in the header.");
      std::endl<char,std::char_traits<char>>(poVar17);
    }
    std::__cxx11::stringbuf::str();
    sVar6 = attr_name._M_string_length;
    std::__cxx11::string::~string((string *)&attr_name);
    if (sVar6 != 0) {
      local_31c = -9;
    }
    if (sVar6 != 0 && err != (string *)0x0) {
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::append((string *)err);
      std::__cxx11::string::~string((string *)&attr_name);
      local_31c = -9;
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&attrib);
    if (sVar6 == 0) {
      info->header_len = (int)size - (int)local_2f0;
      local_31c = 0;
    }
  }
  else {
    local_31c = 0;
    if (empty_header != (bool *)0x0) {
      *empty_header = true;
    }
  }
  return local_31c;
}

Assistant:

static int ParseEXRHeader(HeaderInfo *info, bool *empty_header,
                          const EXRVersion *version, std::string *err,
                          const unsigned char *buf, size_t size) {
  const char *marker = reinterpret_cast<const char *>(&buf[0]);

  if (empty_header) {
    (*empty_header) = false;
  }

  if (version->multipart) {
    if (size > 0 && marker[0] == '\0') {
      // End of header list.
      if (empty_header) {
        (*empty_header) = true;
      }
      return TINYEXR_SUCCESS;
    }
  }

  // According to the spec, the header of every OpenEXR file must contain at
  // least the following attributes:
  //
  // channels chlist
  // compression compression
  // dataWindow box2i
  // displayWindow box2i
  // lineOrder lineOrder
  // pixelAspectRatio float
  // screenWindowCenter v2f
  // screenWindowWidth float
  bool has_channels = false;
  bool has_compression = false;
  bool has_data_window = false;
  bool has_display_window = false;
  bool has_line_order = false;
  bool has_pixel_aspect_ratio = false;
  bool has_screen_window_center = false;
  bool has_screen_window_width = false;

  info->data_window[0] = 0;
  info->data_window[1] = 0;
  info->data_window[2] = 0;
  info->data_window[3] = 0;
  info->line_order = 0;  // @fixme
  info->display_window[0] = 0;
  info->display_window[1] = 0;
  info->display_window[2] = 0;
  info->display_window[3] = 0;
  info->screen_window_center[0] = 0.0f;
  info->screen_window_center[1] = 0.0f;
  info->screen_window_width = -1.0f;
  info->pixel_aspect_ratio = -1.0f;

  info->tile_size_x = -1;
  info->tile_size_y = -1;
  info->tile_level_mode = -1;
  info->tile_rounding_mode = -1;

  info->attributes.clear();

  // Read attributes
  size_t orig_size = size;
  for (size_t nattr = 0; nattr < TINYEXR_MAX_HEADER_ATTRIBUTES; nattr++) {
    if (0 == size) {
      if (err) {
        (*err) += "Insufficient data size for attributes.\n";
      }
      return TINYEXR_ERROR_INVALID_DATA;
    } else if (marker[0] == '\0') {
      size--;
      break;
    }

    std::string attr_name;
    std::string attr_type;
    std::vector<unsigned char> data;
    size_t marker_size;
    if (!tinyexr::ReadAttribute(&attr_name, &attr_type, &data, &marker_size,
                                marker, size)) {
      if (err) {
        (*err) += "Failed to read attribute.\n";
      }
      return TINYEXR_ERROR_INVALID_DATA;
    }
    marker += marker_size;
    size -= marker_size;

    if (version->tiled && attr_name.compare("tiles") == 0) {
      unsigned int x_size, y_size;
      unsigned char tile_mode;
      TEXR_ASSERT(data.size() == 9);
      memcpy(&x_size, &data.at(0), sizeof(int));
      memcpy(&y_size, &data.at(4), sizeof(int));
      tile_mode = data[8];
      tinyexr::swap4(&x_size);
      tinyexr::swap4(&y_size);

      info->tile_size_x = static_cast<int>(x_size);
      info->tile_size_y = static_cast<int>(y_size);

      // mode = levelMode + roundingMode * 16
      info->tile_level_mode = tile_mode & 0x3;
      info->tile_rounding_mode = (tile_mode >> 4) & 0x1;

    } else if (attr_name.compare("compression") == 0) {
      bool ok = false;
      if (data[0] < TINYEXR_COMPRESSIONTYPE_PIZ) {
        ok = true;
      }

      if (data[0] == TINYEXR_COMPRESSIONTYPE_PIZ) {
#if TINYEXR_USE_PIZ
        ok = true;
#else
        if (err) {
          (*err) = "PIZ compression is not supported.";
        }
        return TINYEXR_ERROR_UNSUPPORTED_FORMAT;
#endif
      }

      if (data[0] == TINYEXR_COMPRESSIONTYPE_ZFP) {
#if TINYEXR_USE_ZFP
        ok = true;
#else
        if (err) {
          (*err) = "ZFP compression is not supported.";
        }
        return TINYEXR_ERROR_UNSUPPORTED_FORMAT;
#endif
      }

      if (!ok) {
        if (err) {
          (*err) = "Unknown compression type.";
        }
        return TINYEXR_ERROR_UNSUPPORTED_FORMAT;
      }

      info->compression_type = static_cast<int>(data[0]);
      has_compression = true;

    } else if (attr_name.compare("channels") == 0) {
      // name: zero-terminated string, from 1 to 255 bytes long
      // pixel type: int, possible values are: UINT = 0 HALF = 1 FLOAT = 2
      // pLinear: unsigned char, possible values are 0 and 1
      // reserved: three chars, should be zero
      // xSampling: int
      // ySampling: int

      if (!ReadChannelInfo(info->channels, data)) {
        if (err) {
          (*err) += "Failed to parse channel info.\n";
        }
        return TINYEXR_ERROR_INVALID_DATA;
      }

      if (info->channels.size() < 1) {
        if (err) {
          (*err) += "# of channels is zero.\n";
        }
        return TINYEXR_ERROR_INVALID_DATA;
      }

      has_channels = true;

    } else if (attr_name.compare("dataWindow") == 0) {
      if (data.size() >= 16) {
        memcpy(&info->data_window[0], &data.at(0), sizeof(int));
        memcpy(&info->data_window[1], &data.at(4), sizeof(int));
        memcpy(&info->data_window[2], &data.at(8), sizeof(int));
        memcpy(&info->data_window[3], &data.at(12), sizeof(int));
        tinyexr::swap4(reinterpret_cast<unsigned int *>(&info->data_window[0]));
        tinyexr::swap4(reinterpret_cast<unsigned int *>(&info->data_window[1]));
        tinyexr::swap4(reinterpret_cast<unsigned int *>(&info->data_window[2]));
        tinyexr::swap4(reinterpret_cast<unsigned int *>(&info->data_window[3]));
        has_data_window = true;
      }
    } else if (attr_name.compare("displayWindow") == 0) {
      if (data.size() >= 16) {
        memcpy(&info->display_window[0], &data.at(0), sizeof(int));
        memcpy(&info->display_window[1], &data.at(4), sizeof(int));
        memcpy(&info->display_window[2], &data.at(8), sizeof(int));
        memcpy(&info->display_window[3], &data.at(12), sizeof(int));
        tinyexr::swap4(
            reinterpret_cast<unsigned int *>(&info->display_window[0]));
        tinyexr::swap4(
            reinterpret_cast<unsigned int *>(&info->display_window[1]));
        tinyexr::swap4(
            reinterpret_cast<unsigned int *>(&info->display_window[2]));
        tinyexr::swap4(
            reinterpret_cast<unsigned int *>(&info->display_window[3]));

        has_display_window = true;
      }
    } else if (attr_name.compare("lineOrder") == 0) {
      if (data.size() >= 1) {
        info->line_order = static_cast<int>(data[0]);
        has_line_order = true;
      }
    } else if (attr_name.compare("pixelAspectRatio") == 0) {
      if (data.size() >= sizeof(float)) {
        memcpy(&info->pixel_aspect_ratio, &data.at(0), sizeof(float));
        tinyexr::swap4(
            reinterpret_cast<unsigned int *>(&info->pixel_aspect_ratio));
        has_pixel_aspect_ratio = true;
      }
    } else if (attr_name.compare("screenWindowCenter") == 0) {
      if (data.size() >= 8) {
        memcpy(&info->screen_window_center[0], &data.at(0), sizeof(float));
        memcpy(&info->screen_window_center[1], &data.at(4), sizeof(float));
        tinyexr::swap4(
            reinterpret_cast<unsigned int *>(&info->screen_window_center[0]));
        tinyexr::swap4(
            reinterpret_cast<unsigned int *>(&info->screen_window_center[1]));
        has_screen_window_center = true;
      }
    } else if (attr_name.compare("screenWindowWidth") == 0) {
      if (data.size() >= sizeof(float)) {
        memcpy(&info->screen_window_width, &data.at(0), sizeof(float));
        tinyexr::swap4(
            reinterpret_cast<unsigned int *>(&info->screen_window_width));

        has_screen_window_width = true;
      }
    } else if (attr_name.compare("chunkCount") == 0) {
      if (data.size() >= sizeof(int)) {
        memcpy(&info->chunk_count, &data.at(0), sizeof(int));
        tinyexr::swap4(reinterpret_cast<unsigned int *>(&info->chunk_count));
      }
    } else {
      // Custom attribute(up to TINYEXR_MAX_CUSTOM_ATTRIBUTES)
      if (info->attributes.size() < TINYEXR_MAX_CUSTOM_ATTRIBUTES) {
        EXRAttribute attrib;
#ifdef _MSC_VER
        strncpy_s(attrib.name, attr_name.c_str(), 255);
        strncpy_s(attrib.type, attr_type.c_str(), 255);
#else
        strncpy(attrib.name, attr_name.c_str(), 255);
        strncpy(attrib.type, attr_type.c_str(), 255);
#endif
        attrib.name[255] = '\0';
        attrib.type[255] = '\0';
        attrib.size = static_cast<int>(data.size());
        attrib.value = static_cast<unsigned char *>(malloc(data.size()));
        memcpy(reinterpret_cast<char *>(attrib.value), &data.at(0),
               data.size());
        info->attributes.push_back(attrib);
      }
    }
  }

  // Check if required attributes exist
  {
    std::stringstream ss_err;

    if (!has_compression) {
      ss_err << "\"compression\" attribute not found in the header."
             << std::endl;
    }

    if (!has_channels) {
      ss_err << "\"channels\" attribute not found in the header." << std::endl;
    }

    if (!has_line_order) {
      ss_err << "\"lineOrder\" attribute not found in the header." << std::endl;
    }

    if (!has_display_window) {
      ss_err << "\"displayWindow\" attribute not found in the header."
             << std::endl;
    }

    if (!has_data_window) {
      ss_err << "\"dataWindow\" attribute not found in the header or invalid."
             << std::endl;
    }

    if (!has_pixel_aspect_ratio) {
      ss_err << "\"pixelAspectRatio\" attribute not found in the header."
             << std::endl;
    }

    if (!has_screen_window_width) {
      ss_err << "\"screenWindowWidth\" attribute not found in the header."
             << std::endl;
    }

    if (!has_screen_window_center) {
      ss_err << "\"screenWindowCenter\" attribute not found in the header."
             << std::endl;
    }

    if (!(ss_err.str().empty())) {
      if (err) {
        (*err) += ss_err.str();
      }
      return TINYEXR_ERROR_INVALID_HEADER;
    }
  }

  info->header_len = static_cast<unsigned int>(orig_size - size);

  return TINYEXR_SUCCESS;
}